

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

bool __thiscall QItemSelectionRange::isEmpty(QItemSelectionRange *this)

{
  bool bVar1;
  int iVar2;
  QAbstractItemModel *pQVar3;
  long in_FS_OFFSET;
  int row;
  int column;
  QModelIndex index;
  QFlagsStorage<Qt::ItemFlag> in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_50;
  uint local_4c;
  bool local_39;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isValid((QItemSelectionRange *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((bVar1) &&
     (pQVar3 = model((QItemSelectionRange *)0x8248b0), pQVar3 != (QAbstractItemModel *)0x0)) {
    local_4c = left((QItemSelectionRange *)0x8248ca);
    while (uVar4 = local_4c, iVar2 = right((QItemSelectionRange *)0x8248e0), (int)uVar4 <= iVar2) {
      local_50 = top((QItemSelectionRange *)0x8248f8);
      while (uVar4 = local_50, iVar2 = bottom((QItemSelectionRange *)0x82490e), (int)uVar4 <= iVar2)
      {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = model((QItemSelectionRange *)0x82494a);
        parent((QItemSelectionRange *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80))
        ;
        (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                  (&local_20,pQVar3,(ulong)local_50,(ulong)local_4c,local_38);
        pQVar3 = model((QItemSelectionRange *)0x824995);
        (*(pQVar3->super_QObject)._vptr_QObject[0x27])(pQVar3,&local_20);
        bVar1 = isSelectableAndEnabled((ItemFlags)in_stack_ffffffffffffff7c.i);
        if (bVar1) {
          local_39 = false;
          goto LAB_008249e9;
        }
        local_50 = local_50 + 1;
      }
      local_4c = local_4c + 1;
    }
    local_39 = true;
  }
  else {
    local_39 = true;
  }
LAB_008249e9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QItemSelectionRange::isEmpty() const
{
    if (!isValid() || !model())
        return true;

    for (int column = left(); column <= right(); ++column) {
        for (int row = top(); row <= bottom(); ++row) {
            QModelIndex index = model()->index(row, column, parent());
            if (isSelectableAndEnabled(model()->flags(index)))
                return false;
        }
    }
    return true;
}